

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O2

void anon_unknown.dwarf_227985::testAllCombinations
               (bool isAligned,bool isStereo,Compression pCompression,string *tempDir)

{
  ostream *poVar1;
  int pHeight;
  undefined7 in_register_00000031;
  char *pcVar2;
  int pWidth;
  string pRgba;
  string pRgb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar2 = "imf_optimized_aces_rgb.exr";
  if ((int)CONCAT71(in_register_00000031,isStereo) != 0) {
    pcVar2 = "imf_optimized_aces_rgb_stereo.exr";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pRgb,pcVar2,(allocator<char> *)&pRgba);
  std::operator+(&pRgba,tempDir,&pRgb);
  std::__cxx11::string::operator=((string *)&pRgb,(string *)&pRgba);
  std::__cxx11::string::~string((string *)&pRgba);
  pcVar2 = "imf_optimized_aces_rgba.exr";
  if (isStereo) {
    pcVar2 = "imf_optimized_aces_rgba_stereo.exr";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pRgba,pcVar2,(allocator<char> *)&local_50);
  std::operator+(&local_50,tempDir,&pRgba);
  std::__cxx11::string::operator=((string *)&pRgba,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pHeight = isAligned + 0x47f;
  pWidth = isAligned + 0x7ff;
  remove(pRgb._M_dataplus._M_p);
  remove(pRgba._M_dataplus._M_p);
  writeFile(pRgb._M_dataplus._M_p,pHeight,pWidth,IMAGE_TYPE_RGB,isStereo,pCompression);
  writeFile(pRgba._M_dataplus._M_p,pHeight,pWidth,IMAGE_TYPE_RGBA,isStereo,pCompression);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t\tRGB file to RGB framebuffer");
  std::endl<char,std::char_traits<char>>(poVar1);
  readValidateFile(pRgb._M_dataplus._M_p,pHeight,pWidth,IMAGE_TYPE_RGB,isStereo);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t\tRGB file to RGB framebuffer");
  std::endl<char,std::char_traits<char>>(poVar1);
  readValidateFile(pRgb._M_dataplus._M_p,pHeight,pWidth,IMAGE_TYPE_RGB,isStereo);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t\tRGB file to RGBA framebuffer");
  std::endl<char,std::char_traits<char>>(poVar1);
  readValidateFile(pRgb._M_dataplus._M_p,pHeight,pWidth,IMAGE_TYPE_RGBA,isStereo);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t\tRGBA file to RGB framebuffer");
  std::endl<char,std::char_traits<char>>(poVar1);
  readValidateFile(pRgba._M_dataplus._M_p,pHeight,pWidth,IMAGE_TYPE_RGB,isStereo);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t\tRGBA file to RGBA framebuffer");
  std::endl<char,std::char_traits<char>>(poVar1);
  readValidateFile(pRgba._M_dataplus._M_p,pHeight,pWidth,IMAGE_TYPE_RGBA,isStereo);
  remove(pRgb._M_dataplus._M_p);
  remove(pRgba._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&pRgba);
  std::__cxx11::string::~string((string *)&pRgb);
  return;
}

Assistant:

void
testAllCombinations (
    bool               isAligned,
    bool               isStereo,
    Compression        pCompression,
    const std::string& tempDir)
{
    std::string pRgb  = isStereo ? RGB_STEREO_FILENAME : RGB_FILENAME;
    pRgb              = tempDir + pRgb;
    std::string pRgba = isStereo ? RGBA_STEREO_FILENAME : RGBA_FILENAME;
    pRgba             = tempDir + pRgba;

    const char* pRgbFilename  = pRgb.c_str ();
    const char* pRgbaFilename = pRgba.c_str ();

    const int pHeight = isAligned ? IMAGE_2K_HEIGHT : IMAGE_2K_HEIGHT - 1;
    const int pWidth  = isAligned ? IMAGE_2K_WIDTH : IMAGE_2K_WIDTH - 1;

    remove (pRgbFilename);
    remove (pRgbaFilename);

    writeFile (
        pRgbFilename, pHeight, pWidth, IMAGE_TYPE_RGB, isStereo, pCompression);
    writeFile (
        pRgbaFilename,
        pHeight,
        pWidth,
        IMAGE_TYPE_RGBA,
        isStereo,
        pCompression);

    cout << "\t\tRGB file to RGB framebuffer" << endl;
    readValidateFile (pRgbFilename, pHeight, pWidth, IMAGE_TYPE_RGB, isStereo);

    cout << "\t\tRGB file to RGB framebuffer" << endl;
    readValidateFile (pRgbFilename, pHeight, pWidth, IMAGE_TYPE_RGB, isStereo);

    cout << "\t\tRGB file to RGBA framebuffer" << endl;
    readValidateFile (pRgbFilename, pHeight, pWidth, IMAGE_TYPE_RGBA, isStereo);

    cout << "\t\tRGBA file to RGB framebuffer" << endl;
    readValidateFile (pRgbaFilename, pHeight, pWidth, IMAGE_TYPE_RGB, isStereo);

    cout << "\t\tRGBA file to RGBA framebuffer" << endl;
    readValidateFile (
        pRgbaFilename, pHeight, pWidth, IMAGE_TYPE_RGBA, isStereo);

    remove (pRgbFilename);
    remove (pRgbaFilename);
}